

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O1

RDL_URFinfo * RDL_initUrfInfo(RDL_cfURF *RCFs,RDL_graph *graph)

{
  RDL_cfam **ppRVar1;
  uint uVar2;
  RDL_cfam **ppRVar3;
  RDL_cfam *pRVar4;
  RDL_URFinfo *pRVar5;
  ulong uVar6;
  uint *__s;
  ulong uVar7;
  char ***pppcVar8;
  char **ppcVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  
  pRVar5 = (RDL_URFinfo *)malloc(0x30);
  ppRVar3 = RCFs->fams;
  pRVar4 = *ppRVar3;
  uVar13 = (ulong)RCFs->nofFams;
  if (uVar13 == 0) {
    uVar14 = 1;
  }
  else {
    uVar14 = 1;
    uVar6 = 0;
    uVar12 = pRVar4->weight;
    do {
      ppRVar1 = ppRVar3 + uVar6;
      uVar14 = uVar14 + ((*ppRVar1)->weight != uVar12);
      uVar6 = uVar6 + 1;
      uVar12 = (*ppRVar1)->weight;
    } while (uVar13 != uVar6);
  }
  uVar6 = (ulong)uVar14;
  __s = (uint *)malloc(uVar6 * 4);
  if (uVar14 != 0) {
    memset(__s,0,uVar6 * 4);
  }
  if (uVar13 != 0) {
    uVar7 = 0;
    uVar11 = 0;
    uVar12 = pRVar4->weight;
    do {
      uVar2 = ppRVar3[uVar7]->weight;
      uVar11 = (ulong)((int)uVar11 + (uint)(uVar2 != uVar12));
      __s[uVar11] = __s[uVar11] + 1;
      uVar7 = uVar7 + 1;
      uVar12 = uVar2;
    } while (uVar13 != uVar7);
  }
  pppcVar8 = (char ***)malloc(uVar6 * 8);
  if (uVar14 != 0) {
    uVar13 = 0;
    do {
      uVar12 = __s[uVar13];
      uVar7 = (ulong)uVar12;
      ppcVar9 = (char **)malloc(uVar7 * 8);
      pppcVar8[uVar13] = ppcVar9;
      pcVar10 = (char *)malloc((ulong)(uVar12 * uVar12));
      *ppcVar9 = pcVar10;
      if (1 < uVar7) {
        uVar11 = 1;
        do {
          pppcVar8[uVar13][uVar11] = pppcVar8[uVar13][uVar11 - 1] + uVar7;
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar11);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar6);
    uVar13 = 0;
    do {
      if (__s[uVar13] != 0) {
        uVar7 = 0;
        do {
          if (__s[uVar13] != 0) {
            uVar11 = 0;
            do {
              pppcVar8[uVar13][uVar7][uVar11] = '\0';
              uVar11 = uVar11 + 1;
            } while (uVar11 < __s[uVar13]);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < __s[uVar13]);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar6);
  }
  pRVar5->nofWeights = uVar14;
  pRVar5->nofProtos = __s;
  pRVar5->URFrel = pppcVar8;
  return pRVar5;
}

Assistant:

RDL_URFinfo *RDL_initUrfInfo(RDL_cfURF *RCFs, RDL_graph *graph)
{
  RDL_URFinfo *urfInfo;
  char ***URFrel;
  unsigned numOfWeights = 1;
  unsigned *numOfProtos;
  unsigned i, j, k, currWeight, currIdx;
  urfInfo = malloc(sizeof(*urfInfo));

  /* count number of different weights occuring*/
  currWeight = RCFs->fams[0]->weight;
  for(i=0; i<RCFs->nofFams; ++i)
  {
    if(RCFs->fams[i]->weight != currWeight)
    {
      ++numOfWeights;
      currWeight = RCFs->fams[i]->weight;
    }
  }

  /* for each weight count number of different prototypes */
  numOfProtos = malloc(numOfWeights * sizeof(*numOfProtos));
  for(i=0; i<numOfWeights; ++i)
  {
    numOfProtos[i] = 0;
  }
  currWeight = RCFs->fams[0]->weight;
  currIdx = 0;
  for(i=0; i<RCFs->nofFams; ++i)
  {
    if(RCFs->fams[i]->weight != currWeight)
    {
      ++currIdx;
      currWeight = RCFs->fams[i]->weight;
    }
    ++numOfProtos[currIdx];
  }

   /*allocate everything*/
  URFrel = malloc(numOfWeights * sizeof(*URFrel));
  for(i=0; i<numOfWeights; ++i)
  {
    URFrel[i] = malloc(numOfProtos[i] * sizeof(*URFrel[i]));
    *URFrel[i] = malloc(numOfProtos[i] * numOfProtos[i] * sizeof(**URFrel[i]));
    for(j=1; j<numOfProtos[i]; ++j)
    {
      URFrel[i][j] = URFrel[i][j-1] + numOfProtos[i];
    }
  }

  /*initialize with zeros*/
  for(i=0; i<numOfWeights; ++i)
  {
    for(j=0; j<numOfProtos[i]; ++j)
    {
      for(k=0; k<numOfProtos[i]; ++k)
      {
        URFrel[i][j][k] = 0;
      }
    }
  }

  urfInfo->nofWeights = numOfWeights;
  urfInfo->nofProtos = numOfProtos;
  urfInfo->URFrel = URFrel;

  return urfInfo;
}